

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

bool el::base::utils::Utils::
     installCallback<el::base::DefaultLogDispatchCallback,std::shared_ptr<el::LogDispatchCallback>>
               (string *id,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
               *mapT)

{
  unordered_map<std::__cxx11::string,std::shared_ptr<el::LogDispatchCallback>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>>>
  *this;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
  *__x;
  bool bVar1;
  DefaultLogDispatchCallback *this_00;
  shared_ptr<el::LogDispatchCallback> local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
  local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>,_true>
  local_28;
  unordered_map<std::__cxx11::string,std::shared_ptr<el::LogDispatchCallback>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>>>
  *local_20;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
  *mapT_local;
  string *id_local;
  
  local_20 = (unordered_map<std::__cxx11::string,std::shared_ptr<el::LogDispatchCallback>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>>>
              *)mapT;
  mapT_local = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
                *)id;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
       ::find(mapT,id);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
              *)local_20);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  __x = mapT_local;
  this = local_20;
  if (bVar1) {
    this_00 = (DefaultLogDispatchCallback *)operator_new(0x58);
    (this_00->super_LogDispatchCallback).m_fileLocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
    *(undefined8 *)&(this_00->super_LogDispatchCallback).field_0x48 = 0;
    *(undefined8 *)&(this_00->super_LogDispatchCallback).m_fileLocks._M_h._M_rehash_policy = 0;
    (this_00->super_LogDispatchCallback).m_fileLocks._M_h._M_rehash_policy._M_next_resize = 0;
    (this_00->super_LogDispatchCallback).m_fileLocks._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)0x0;
    (this_00->super_LogDispatchCallback).m_fileLocks._M_h._M_element_count = 0;
    (this_00->super_LogDispatchCallback).m_fileLocks._M_h._M_buckets = (__buckets_ptr)0x0;
    (this_00->super_LogDispatchCallback).m_fileLocks._M_h._M_bucket_count = 0;
    (this_00->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.
    _vptr_ThreadSafe = (_func_int **)0x0;
    *(undefined8 *)
     &(this_00->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.
      field_0x8 = 0;
    this_00->m_data = (LogDispatchData *)0x0;
    DefaultLogDispatchCallback::DefaultLogDispatchCallback(this_00);
    ::std::shared_ptr<el::LogDispatchCallback>::
    shared_ptr<el::base::DefaultLogDispatchCallback,void>(&local_70,this_00);
    ::std::make_pair<std::__cxx11::string_const&,std::shared_ptr<el::LogDispatchCallback>>
              (&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x,
               &local_70);
    ::std::
    unordered_map<std::__cxx11::string,std::shared_ptr<el::LogDispatchCallback>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>>>
    ::insert<std::pair<std::__cxx11::string,std::shared_ptr<el::LogDispatchCallback>>>
              (this,&local_60);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
    ::~pair(&local_60);
    std::shared_ptr<el::LogDispatchCallback>::~shared_ptr(&local_70);
  }
  return bVar1;
}

Assistant:

static bool installCallback(const std::string& id, std::unordered_map<std::string, TPtr>* mapT) {
    if (mapT->find(id) == mapT->end()) {
      mapT->insert(std::make_pair(id, TPtr(new T())));
      return true;
    }
    return false;
  }